

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text,bool force)

{
  pointer ppcVar1;
  cmake *this_00;
  bool bVar2;
  cmListFileContext lfc;
  cmOutputConverter converter;
  undefined1 local_b8 [32];
  string local_98;
  long local_78;
  string local_70;
  string local_50;
  
  ppcVar1 = (this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->ExecutionStatusStack).
      super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppcVar1) {
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._8_8_ = 0;
    local_b8[0x10] = '\0';
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_78 = 0;
    local_98._M_dataplus._M_p = local_b8 + 0x30;
    GetExecutionFilePath_abi_cxx11_(&local_70,this);
    std::__cxx11::string::operator=((string *)(local_b8 + 0x20),(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    bVar2 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance);
    if (!bVar2) {
      cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_70,this->StateSnapshot);
      cmOutputConverter::Convert
                (&local_50,(cmOutputConverter *)&local_70,(string *)(local_b8 + 0x20),HOME,UNCHANGED
                );
      std::__cxx11::string::operator=((string *)(local_b8 + 0x20),(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    local_78 = 0;
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,t,text,(cmListFileContext *)local_b8,
                        force);
    if (local_98._M_dataplus._M_p != local_b8 + 0x30) {
      operator_delete(local_98._M_dataplus._M_p,
                      CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                               local_98.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
    }
  }
  else {
    if ((t & ~AUTHOR_ERROR) == FATAL_ERROR) {
      ppcVar1[-1]->NestedError = true;
    }
    this_00 = this->GlobalGenerator->CMakeInstance;
    GetBacktrace((cmListFileBacktrace *)local_b8,this);
    cmake::IssueMessage(this_00,t,text,(cmListFileBacktrace *)local_b8,force);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_b8);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text,
                              bool force) const
{
  // Collect context information.
  if(!this->ExecutionStatusStack.empty())
    {
    if((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR))
      {
      this->ExecutionStatusStack.back()->SetNestedError(true);
      }
    this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace(),
                                           force);
    }
  else
    {
    cmListFileContext lfc;
    // We are not currently executing a command.  Add whatever context
    // information we have.
    lfc.FilePath = this->GetExecutionFilePath();

    if(!this->GetCMakeInstance()->GetIsInTryCompile())
      {
      cmOutputConverter converter(this->StateSnapshot);
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      }
    lfc.Line = 0;
    this->GetCMakeInstance()->IssueMessage(t, text, lfc, force);
    }
}